

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::ScopedTrace::~ScopedTrace(ScopedTrace *this)

{
  UnitTest *this_00;
  ScopedTrace *this_local;
  
  this_00 = UnitTest::GetInstance();
  UnitTest::PopGTestTrace(this_00);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(&UnitTest::mutex_) {
  UnitTest::GetInstance()->PopGTestTrace();
}